

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

int __thiscall
UnifiedRegex::
SyncToLiteralAndBackupInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
::Print(SyncToLiteralAndBackupInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
        *this,DebugWriter *w,Label label,Char *litbuf)

{
  undefined4 in_register_00000014;
  Inst *inst;
  DebugWriter *this_00;
  
  DebugWriter::Print(w,L"L%04x: ",CONCAT44(in_register_00000014,label));
  if (DAT_015bc47d == '\x01') {
    DebugWriter::Print(w,L"(0x%03x bytes) ",0x451);
  }
  DebugWriter::Print(w,L"SyncToLiteralAndBackupInstT<ScannerMixin> aka SyncToLiteralAndBackup");
  DebugWriter::Print(w,L"(");
  DebugWriter::Print(w,L"literal: ");
  DebugWriter::PrintQuotedString
            (w,litbuf + (this->super_ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>).
                        super_LiteralMixin.offset,
             (this->super_ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>).
             super_LiteralMixin.length);
  DebugWriter::Print(w,L" (with %s scanner)",L"full map Boyer-Moore");
  DebugWriter::Print(w,L", ");
  DebugWriter::Print(w,L"backup: ");
  CountDomain::Print(&(this->super_BackupMixin).backup,w);
  DebugWriter::PrintEOL(w,L")");
  if (DAT_015bc47d == '\x01') {
    this_00 = w;
    DebugWriter::Indent(w);
    Inst::PrintBytes<UnifiedRegex::Inst>((Inst *)this_00,w,inst,&this->super_Inst,L"Inst");
    Inst::PrintBytes<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>>>
              (&this->super_Inst,w,&this->super_Inst,
               &this->super_ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>,
               L"ScannerMixin");
    Inst::PrintBytes<UnifiedRegex::BackupMixin>
              (&this->super_Inst,w,&this->super_Inst,&this->super_BackupMixin,L"BackupMixin");
    DebugWriter::Unindent(w);
  }
  return 0x451;
}

Assistant:

int SyncToLiteralAndBackupInstT<ScannerMixin>::Print(DebugWriter* w, Label label, const Char* litbuf) const
    {
        // NOTE: this text is unique to this instantiation
        PRINT_RE_BYTECODE_BEGIN("SyncToLiteralAndBackupInstT<ScannerMixin> aka SyncToLiteralAndBackup");
        PRINT_MIXIN_COMMA(ScannerMixin); // NOTE: would work with template <typename ScannerT> ScannerT::Print
        PRINT_MIXIN(BackupMixin);
        PRINT_RE_BYTECODE_MID();
        PRINT_BYTES(ScannerMixin); // NOTE: unique because macro expansion and _u(#InstType) happen before template is evaluated (so text would be ScannerT)
        PRINT_BYTES(BackupMixin);
        PRINT_RE_BYTECODE_END();
    }